

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_10521be::cmLBDepend::GenerateDependInformation
          (cmLBDepend *this,cmDependInformation *info)

{
  pointer pbVar1;
  cmMakefile *this_00;
  size_t __n;
  pointer pcVar2;
  char *__n_00;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  cmSourceFile *pcVar8;
  string *psVar9;
  undefined8 uVar10;
  char cVar11;
  _Alloc_hider _Var12;
  pointer pbVar13;
  string *path;
  const_iterator __begin4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type __dnew;
  string cxxFile;
  string root;
  string includeFile;
  string line;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_308;
  size_type local_300;
  pointer local_2f8;
  cmLBDepend *local_2f0;
  string local_2e8;
  string local_2c8;
  string *local_2a8;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  string local_280;
  string local_260;
  RegularExpression *local_240;
  string local_238;
  byte abStack_218 [488];
  
  if (info->DependDone != false) {
    return;
  }
  info->DependDone = true;
  if ((info->FullPath)._M_string_length == 0) {
    local_330._M_dataplus._M_p = (pointer)0x33;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    local_238._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_238,(ulong)&local_330);
    local_238.field_2._M_allocated_capacity = (size_type)local_330._M_dataplus._M_p;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x20) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x21) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x22) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x23) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x24) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x25) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x26) = 'w';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x27) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x28) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x29) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2a) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2b) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2c) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2d) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2e) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2f) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x10) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x11) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x12) = 'p';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x13) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x14) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x15) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x16) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x17) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x18) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x19) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1a) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1b) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1c) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1d) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1e) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x1f) = 'r';
    *(undefined8 *)local_238._M_dataplus._M_p = 0x2074706d65747441;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 8) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 9) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 10) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xb) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xc) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xd) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xe) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0xf) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x2f) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x30) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x31) = 'h';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p + 0x32) = '!';
    local_238._M_string_length = (size_type)local_330._M_dataplus._M_p;
    local_238._M_dataplus._M_p[(long)local_330._M_dataplus._M_p] = '\0';
    cmSystemTools::Error(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p == &local_238.field_2) {
      return;
    }
    goto LAB_0033ab95;
  }
  psVar9 = &info->FullPath;
  bVar3 = cmsys::SystemTools::FileExists(psVar9,true);
  local_2f0 = this;
  local_2a8 = psVar9;
  if (bVar3) {
    std::ifstream::ifstream(&local_238,(psVar9->_M_dataplus)._M_p,_S_in);
    if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      local_260._M_string_length = 0;
      local_260.field_2._M_local_buf[0] = '\0';
      local_240 = &this->IncludeFileRegularExpression;
LAB_0033abe5:
      do {
        bVar3 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_238,&local_260,(bool *)0x0,0xffffffffffffffff);
        if (!bVar3) goto LAB_0033b358;
        local_330._M_dataplus._M_p = (pointer)local_260._M_string_length;
        local_330._M_string_length = (size_type)local_260._M_dataplus._M_p;
        __str._M_str = "#include";
        __str._M_len = 8;
        iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_330,0,8,__str)
        ;
        if (iVar6 == 0) {
          cVar11 = (char)&local_260;
          lVar7 = std::__cxx11::string::find(cVar11,0x22);
          if (lVar7 == -1) {
            lVar7 = std::__cxx11::string::find(cVar11,0x3c);
            if (lVar7 != -1) {
              bVar4 = 0x3e;
              goto LAB_0033ac8a;
            }
            std::operator+(&local_330,"unknown include directive ",&local_260);
            cmSystemTools::Error(&local_330);
            uVar10 = local_330.field_2._M_allocated_capacity;
            _Var12._M_p = local_330._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p == &local_330.field_2) goto LAB_0033abe5;
          }
          else {
            bVar4 = 0x22;
LAB_0033ac8a:
            std::__cxx11::string::find((char)&local_260,(ulong)bVar4);
            std::__cxx11::string::substr((ulong)&local_280,(ulong)&local_260);
            bVar3 = cmsys::RegularExpression::find
                              (local_240,local_280._M_dataplus._M_p,&local_240->regmatch);
            if (bVar3) {
              AddDependency(local_2f0,info,&local_280);
              local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2e8,local_280._M_dataplus._M_p,
                         local_280._M_dataplus._M_p + local_280._M_string_length);
              lVar7 = std::__cxx11::string::rfind((char)&local_2e8,0x2e);
              if (lVar7 != -1) {
                std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_2e8);
                local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                std::__cxx11::string::append((char *)&local_330);
                std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_330);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_330._M_dataplus._M_p != &local_330.field_2) {
                  operator_delete(local_330._M_dataplus._M_p,
                                  local_330.field_2._M_allocated_capacity + 1);
                }
                bVar3 = cmsys::SystemTools::FileExists(&local_2e8);
                pbVar1 = (local_2f0->IncludeDirectories).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pbVar13 = (local_2f0->IncludeDirectories).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
                    pbVar13 = pbVar13 + 1) {
                  local_330._M_string_length = (size_type)(pbVar13->_M_dataplus)._M_p;
                  local_330._M_dataplus._M_p = (pointer)pbVar13->_M_string_length;
                  local_330.field_2._M_allocated_capacity = 1;
                  local_330.field_2._8_8_ =
                       (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                  local_310 = local_2e8._M_string_length;
                  local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2e8._M_dataplus._M_p;
                  views._M_len = 3;
                  views._M_array = (iterator)&local_330;
                  cmCatViews_abi_cxx11_(&local_2c8,views);
                  bVar5 = cmsys::SystemTools::FileExists(&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar5) {
                    bVar3 = true;
                  }
                }
                if (bVar3 == false) {
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                  std::__cxx11::string::append((char *)&local_330);
                  std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_330);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                  bVar5 = cmsys::SystemTools::FileExists(&local_2e8);
                  if (bVar5) {
                    bVar3 = true;
                  }
                  pbVar1 = (local_2f0->IncludeDirectories).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar13 = (local_2f0->IncludeDirectories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
                      pbVar13 = pbVar13 + 1) {
                    local_330._M_string_length = (size_type)(pbVar13->_M_dataplus)._M_p;
                    local_330._M_dataplus._M_p = (pointer)pbVar13->_M_string_length;
                    local_330.field_2._M_allocated_capacity = 1;
                    local_330.field_2._8_8_ =
                         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                    local_310 = local_2e8._M_string_length;
                    local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2e8._M_dataplus._M_p;
                    views_01._M_len = 3;
                    views_01._M_array = (iterator)&local_330;
                    cmCatViews_abi_cxx11_(&local_2c8,views_01);
                    bVar5 = cmsys::SystemTools::FileExists(&local_2c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      bVar3 = true;
                    }
                  }
                }
                if (bVar3 == false) {
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                  std::__cxx11::string::append((char *)&local_330);
                  std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_330);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                  bVar5 = cmsys::SystemTools::FileExists(&local_2e8);
                  if (bVar5) {
                    bVar3 = true;
                  }
                  pbVar1 = (local_2f0->IncludeDirectories).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar13 = (local_2f0->IncludeDirectories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
                      pbVar13 = pbVar13 + 1) {
                    local_330._M_string_length = (size_type)(pbVar13->_M_dataplus)._M_p;
                    local_330._M_dataplus._M_p = (pointer)pbVar13->_M_string_length;
                    local_330.field_2._M_allocated_capacity = 1;
                    local_330.field_2._8_8_ =
                         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                    local_310 = local_2e8._M_string_length;
                    local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2e8._M_dataplus._M_p;
                    views_02._M_len = 3;
                    views_02._M_array = (iterator)&local_330;
                    cmCatViews_abi_cxx11_(&local_2c8,views_02);
                    bVar5 = cmsys::SystemTools::FileExists(&local_2c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      bVar3 = true;
                    }
                  }
                }
                if (bVar3 == false) {
                  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_330,local_2a0,local_298 + (long)local_2a0);
                  std::__cxx11::string::append((char *)&local_330);
                  std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_330);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_330._M_dataplus._M_p != &local_330.field_2) {
                    operator_delete(local_330._M_dataplus._M_p,
                                    local_330.field_2._M_allocated_capacity + 1);
                  }
                  bVar5 = cmsys::SystemTools::FileExists(&local_2e8);
                  if (bVar5) {
                    bVar3 = true;
                  }
                  pbVar1 = (local_2f0->IncludeDirectories).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pbVar13 = (local_2f0->IncludeDirectories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar1;
                      pbVar13 = pbVar13 + 1) {
                    local_330._M_string_length = (size_type)(pbVar13->_M_dataplus)._M_p;
                    local_330._M_dataplus._M_p = (pointer)pbVar13->_M_string_length;
                    local_330.field_2._M_allocated_capacity = 1;
                    local_330.field_2._8_8_ =
                         (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
                    local_310 = local_2e8._M_string_length;
                    local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2e8._M_dataplus._M_p;
                    views_03._M_len = 3;
                    views_03._M_array = (iterator)&local_330;
                    cmCatViews_abi_cxx11_(&local_2c8,views_03);
                    bVar5 = cmsys::SystemTools::FileExists(&local_2c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                      operator_delete(local_2c8._M_dataplus._M_p,
                                      local_2c8.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar5) {
                      bVar3 = true;
                    }
                  }
                }
                if (bVar3 != false) {
                  AddDependency(local_2f0,info,&local_2e8);
                }
                if (local_2a0 != local_290) {
                  operator_delete(local_2a0,local_290[0] + 1);
                }
              }
LAB_0033af5f:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                operator_delete(local_2e8._M_dataplus._M_p,
                                local_2e8.field_2._M_allocated_capacity + 1);
              }
            }
            else if (local_2f0->Verbose == true) {
              local_330._M_dataplus._M_p = (pointer)0x9;
              local_330._M_string_length = 0x6fee86;
              local_330.field_2._M_allocated_capacity = local_280._M_string_length;
              local_330.field_2._8_8_ = local_280._M_dataplus._M_p;
              local_310 = 10;
              local_308 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x6fee90;
              local_2f8 = (info->FullPath)._M_dataplus._M_p;
              local_300 = (info->FullPath)._M_string_length;
              views_00._M_len = 4;
              views_00._M_array = (iterator)&local_330;
              cmCatViews_abi_cxx11_(&local_2e8,views_00);
              cmSystemTools::Error(&local_2e8);
              goto LAB_0033af5f;
            }
            uVar10 = local_280.field_2._M_allocated_capacity;
            _Var12._M_p = local_280._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p == &local_280.field_2) goto LAB_0033abe5;
          }
          operator_delete(_Var12._M_p,uVar10 + 1);
        }
      } while( true );
    }
    std::operator+(&local_330,"error can not open ",psVar9);
    cmSystemTools::Error(&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    goto LAB_0033b37a;
  }
  bVar3 = false;
LAB_0033b38a:
  pcVar8 = info->SourceFile;
  if (pcVar8 != (cmSourceFile *)0x0) {
    pbVar13 = (pcVar8->Depends).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pcVar8->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar13 != pbVar1) {
      do {
        AddDependency(this,info,pbVar13);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar1);
      return;
    }
  }
  if (!bVar3) {
    this_00 = this->Makefile;
    cmsys::SystemTools::GetFilenameWithoutExtension(&local_238,local_2a8);
    pcVar8 = cmMakefile::GetSource(this_00,&local_238,Ambiguous);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      (ulong)(local_238.field_2._M_allocated_capacity + 1));
    }
    if (pcVar8 != (cmSourceFile *)0x0) {
      psVar9 = cmSourceFile::ResolveFullPath(pcVar8,(string *)0x0,(string *)0x0);
      __n = psVar9->_M_string_length;
      if (__n == (info->FullPath)._M_string_length) {
        if (__n == 0) {
          return;
        }
        iVar6 = bcmp((psVar9->_M_dataplus)._M_p,(local_2a8->_M_dataplus)._M_p,__n);
        if (iVar6 == 0) {
          return;
        }
      }
      pbVar13 = (this->IncludeDirectories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (this->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar13 != pbVar1) {
        do {
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          pcVar2 = (pbVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,pcVar2,pcVar2 + pbVar13->_M_string_length);
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_string_length !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) && ((local_238._M_dataplus._M_p + -1)[local_238._M_string_length] != '/')) {
            std::__cxx11::string::append((char *)&local_238);
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_238,(ulong)(info->FullPath)._M_dataplus._M_p);
          psVar9 = cmSourceFile::ResolveFullPath(pcVar8,(string *)0x0,(string *)0x0);
          __n_00 = (char *)psVar9->_M_string_length;
          if ((__n_00 == (char *)local_238._M_string_length) &&
             ((__n_00 == (char *)0x0 ||
              (iVar6 = bcmp((psVar9->_M_dataplus)._M_p,local_238._M_dataplus._M_p,(size_t)__n_00),
              iVar6 == 0)))) {
            bVar3 = true;
            std::__cxx11::string::_M_assign((string *)local_2a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,
                            (ulong)(local_238.field_2._M_allocated_capacity + 1));
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar1);
      }
    }
  }
  if (bVar3) {
    return;
  }
  bVar3 = cmsys::RegularExpression::find
                    (&local_2f0->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p,
                     &(local_2f0->ComplainFileRegularExpression).regmatch);
  if (!bVar3) {
    (info->FullPath)._M_string_length = 0;
    *(info->FullPath)._M_dataplus._M_p = '\0';
    return;
  }
  std::operator+(&local_238,"error cannot find dependencies for ",local_2a8);
  cmSystemTools::Error(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p == &local_238.field_2) {
    return;
  }
LAB_0033ab95:
  operator_delete(local_238._M_dataplus._M_p,(ulong)(local_238.field_2._M_allocated_capacity + 1));
  return;
LAB_0033b358:
  this = local_2f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
    this = local_2f0;
  }
LAB_0033b37a:
  std::ifstream::~ifstream(&local_238);
  bVar3 = true;
  goto LAB_0033b38a;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file);
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->ResolveFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath += "/";
            }
            incpath += path;
            if (srcFile->ResolveFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }